

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_tai.cpp
# Opt level: O1

i32_t Kumu::caldate_mjd(caldate *cd)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  if (cd != (caldate *)0x0) {
    iVar5 = cd->month;
    iVar2 = iVar5 + 9;
    if (2 < iVar5) {
      iVar2 = iVar5 + -3;
    }
    iVar3 = (iVar2 / 6 + (iVar2 >> 0x1f) >> 1) - (iVar2 >> 0x1f);
    uVar4 = iVar2 + iVar3 * -0xc;
    iVar5 = ((int)uVar4 >> 0x1f) + (cd->year % 400 - (uint)(iVar5 < 3)) + iVar3;
    uVar1 = iVar2 + 0xc + iVar3 * -0xc;
    if (-1 < (int)uVar4) {
      uVar1 = uVar4;
    }
    iVar3 = cd->day + *(int *)(montab + (ulong)uVar1 * 4);
    iVar2 = (cd->year / 400 + iVar5 / 400) * 0x23ab1;
    uVar4 = iVar5 % 400;
    uVar1 = uVar4 + 400;
    if (-1 < (int)uVar4) {
      uVar1 = uVar4;
    }
    iVar5 = iVar2 + -0xc9693 + iVar3;
    if (-1 < (int)uVar4) {
      iVar5 = iVar2 + iVar3 + -0xa5be2;
    }
    return *(int *)(times36524 + (ulong)(uVar1 / 100 & 3) * 4) +
           *(int *)(times365 + (ulong)(uVar1 & 3) * 4) + iVar5 + ((uVar1 >> 2) % 0x19) * 0x5b5;
  }
  __assert_fail("cd",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_tai.cpp"
                ,0x71,"i32_t Kumu::caldate_mjd(const Kumu::TAI::caldate *)");
}

Assistant:

i32_t
caldate_mjd(const Kumu::TAI::caldate* cd)
{
  assert(cd);
  i32_t y, m, d;

  d = cd->day - 678882L;
  m = cd->month - 1;
  y = cd->year;

  d += 146097L * (y / 400);
  y %= 400;

  if (m >= 2) m -= 2; else { m += 10; --y; }

  y += (m / 12);
  m %= 12;
  if (m < 0) { m += 12; --y; }

  d += montab[m];

  d += 146097L * (y / 400);
  y %= 400;
  if (y < 0) { y += 400; d -= 146097L; }

  d += times365[y & 3];
  y >>= 2;

  d += 1461L * (y % 25);
  y /= 25;

  d += times36524[y & 3];

  return d;
}